

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

long __thiscall
mpt::reference_array<mpt::cycle>::clear(reference_array<mpt::cycle> *this,cycle *ref)

{
  iterator prVar1;
  long lVar2;
  cycle *pcVar3;
  cycle *match;
  long len;
  long i;
  long elem;
  reference<mpt::cycle> *ptr;
  cycle *ref_local;
  reference_array<mpt::cycle> *this_local;
  
  prVar1 = unique_array<mpt::reference<mpt::cycle>_>::begin
                     (&this->super_unique_array<mpt::reference<mpt::cycle>_>);
  i = 0;
  len = 0;
  lVar2 = unique_array<mpt::reference<mpt::cycle>_>::length
                    (&this->super_unique_array<mpt::reference<mpt::cycle>_>);
  for (; len < lVar2; len = len + 1) {
    pcVar3 = reference<mpt::cycle>::instance(prVar1 + len);
    if ((pcVar3 != (cycle *)0x0) && ((ref == (cycle *)0x0 || (pcVar3 == ref)))) {
      reference<mpt::cycle>::set_instance(prVar1 + len,(cycle *)0x0);
      i = i + 1;
    }
  }
  return i;
}

Assistant:

long clear(const T *ref = 0) const
	{
		reference<T> *ptr = this->begin();
		long elem = 0;
		
		for (long i = 0, len = this->length(); i < len; ++i) {
			T *match = ptr[i].instance();
			if (!match || (ref && (match != ref))) {
				continue;
			}
			ptr[i].set_instance(0);
			++elem;
		}
		return elem;
	}